

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O1

bool __thiscall
google::protobuf::compiler::CommandLineInterface::ParseInputFiles
          (CommandLineInterface *this,DescriptorPool *descriptor_pool,DiskSourceTree *source_tree,
          vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
          *parsed_files)

{
  pointer pbVar1;
  iterator __position;
  pointer pcVar2;
  lts_20250127 *this_00;
  bool bVar3;
  ostream *poVar4;
  FileDescriptor *pFVar5;
  pointer pbVar6;
  bool bVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *input_file;
  vector<google::protobuf::FileDescriptor_const*,std::allocator<google::protobuf::FileDescriptor_const*>>
  *this_01;
  size_type in_R9;
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::__cxx11::string>>
  *this_02;
  int index;
  int iVar8;
  string_view file_name;
  string_view name;
  string_view s;
  FixedMapping replacements;
  FileDescriptor *parsed_file;
  FileDescriptor *local_b0;
  pointer local_a8;
  vector<google::protobuf::FileDescriptor_const*,std::allocator<google::protobuf::FileDescriptor_const*>>
  *local_a0;
  DescriptorPool *local_98;
  string local_90;
  pointer local_70;
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::__cxx11::string>>
  *local_68;
  key_arg<std::basic_string_view<char>_> local_60;
  size_type local_50;
  pointer local_48;
  iterator local_40;
  
  local_a0 = (vector<google::protobuf::FileDescriptor_const*,std::allocator<google::protobuf::FileDescriptor_const*>>
              *)parsed_files;
  if ((this->proto_path_).
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->proto_path_).
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pbVar1 = (this->input_files_).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pbVar6 = (this->input_files_).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; pbVar6 != pbVar1; pbVar6 = pbVar6 + 1)
    {
      file_name._M_str = (pbVar6->_M_dataplus)._M_p;
      file_name._M_len = pbVar6->_M_string_length;
      DescriptorPool::AddDirectInputFile(descriptor_pool,file_name,false);
    }
  }
  pbVar6 = (this->input_files_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_70 = (this->input_files_).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar6 == local_70) {
    bVar7 = true;
  }
  else {
    this_02 = (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::__cxx11::string>>
               *)&this->direct_dependencies_;
    bVar7 = true;
    this_01 = local_a0;
    local_98 = descriptor_pool;
    local_68 = this_02;
    do {
      name._M_str = (pbVar6->_M_dataplus)._M_p;
      name._M_len = pbVar6->_M_string_length;
      local_a8 = pbVar6;
      local_b0 = DescriptorPool::FindFileByName(local_98,name);
      if (local_b0 == (FileDescriptor *)0x0) {
LAB_001d5c95:
        bVar7 = false;
        iVar8 = 1;
      }
      else {
        __position._M_current = *(FileDescriptor ***)(this_01 + 8);
        if (__position._M_current == *(FileDescriptor ***)(this_01 + 0x10)) {
          std::
          vector<google::protobuf::FileDescriptor_const*,std::allocator<google::protobuf::FileDescriptor_const*>>
          ::_M_realloc_insert<google::protobuf::FileDescriptor_const*const&>
                    (this_01,__position,&local_b0);
        }
        else {
          *__position._M_current = local_b0;
          *(long *)(this_01 + 8) = *(long *)(this_01 + 8) + 8;
        }
        if ((this->disallow_services_ == true) && (0 < local_b0->service_count_)) {
          poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cerr,(local_b0->name_->_M_dataplus)._M_p,
                              local_b0->name_->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar4,": This file contains services, but --disallow_services was used.",0x40)
          ;
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
          this_01 = local_a0;
          std::ostream::put((char)poVar4);
          std::ostream::flush();
          goto LAB_001d5c95;
        }
        if (this->direct_dependencies_explicitly_set_ == true) {
          index = 0;
          iVar8 = index;
          if (0 < local_b0->dependency_count_) {
            iVar8 = 0;
            do {
              pFVar5 = FileDescriptor::dependency(local_b0,index);
              local_60._M_str = (pFVar5->name_->_M_dataplus)._M_p;
              local_60._M_len = pFVar5->name_->_M_string_length;
              local_90._0_16_ =
                   absl::lts_20250127::container_internal::
                   raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::__cxx11::string>>
                   ::find<std::basic_string_view<char,std::char_traits<char>>>(this_02,&local_60);
              absl::lts_20250127::container_internal::
              raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::AssertNotDebugCapacity
                        ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)this_02);
              local_40.ctrl_ = (ctrl_t *)0x0;
              bVar3 = absl::lts_20250127::container_internal::operator==
                                ((iterator *)&local_90,&local_40);
              if (bVar3) {
                poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                                   ((ostream *)&std::cerr,(local_b0->name_->_M_dataplus)._M_p,
                                    local_b0->name_->_M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>(poVar4,": ",2);
                pcVar2 = (this->direct_dependencies_violation_msg_)._M_dataplus._M_p;
                this_00 = (lts_20250127 *)
                          (this->direct_dependencies_violation_msg_)._M_string_length;
                pFVar5 = FileDescriptor::dependency(local_b0,index);
                local_48 = (pFVar5->name_->_M_dataplus)._M_p;
                local_50 = pFVar5->name_->_M_string_length;
                local_60._M_len = 2;
                local_60._M_str = "%s";
                s._M_str = (char *)&local_60;
                s._M_len = (size_t)pcVar2;
                replacements._M_len = in_R9;
                replacements._M_array = (iterator)0x1;
                absl::lts_20250127::StrReplaceAll_abi_cxx11_(&local_90,this_00,s,replacements);
                poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                                   (poVar4,local_90._M_dataplus._M_p,local_90._M_string_length);
                std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
                std::ostream::put((char)poVar4);
                std::ostream::flush();
                if ((iterator *)local_90._M_dataplus._M_p != (iterator *)&local_90.field_2) {
                  operator_delete(local_90._M_dataplus._M_p,
                                  local_90.field_2._M_allocated_capacity + 1);
                }
                iVar8 = 1;
                this_02 = local_68;
              }
              index = index + 1;
              this_01 = local_a0;
            } while (index < local_b0->dependency_count_);
          }
          if (iVar8 != 0) {
            bVar7 = false;
          }
        }
        else {
          iVar8 = 0;
        }
      }
      descriptor_pool = local_98;
    } while ((iVar8 == 0) && (pbVar6 = local_a8 + 1, pbVar6 != local_70));
  }
  DescriptorPool::ClearDirectInputFiles(descriptor_pool);
  return bVar7;
}

Assistant:

bool CommandLineInterface::ParseInputFiles(
    DescriptorPool* descriptor_pool, DiskSourceTree* source_tree,
    std::vector<const FileDescriptor*>* parsed_files) {

  if (!proto_path_.empty()) {
    // Track unused imports in all source files that were loaded from the
    // filesystem. We do not track unused imports for files loaded from
    // descriptor sets as they may be programmatically generated in which case
    // exerting this level of rigor is less desirable. We're also making the
    // assumption that the initial parse of the proto from the filesystem
    // was rigorous in checking unused imports and that the descriptor set
    // being parsed was produced then and that it was subsequent mutations
    // of that descriptor set that left unused imports.
    //
    // Note that relying on proto_path exclusively is limited in that we may
    // be loading descriptors from both the filesystem and descriptor sets
    // depending on the invocation. At least for invocations that are
    // exclusively reading from descriptor sets, we can eliminate this failure
    // condition.
    for (const auto& input_file : input_files_) {
      descriptor_pool->AddDirectInputFile(input_file);
    }
  }

  bool result = true;
  // Parse each file.
  for (const auto& input_file : input_files_) {
    // Import the file.
    const FileDescriptor* parsed_file =
        descriptor_pool->FindFileByName(input_file);
    if (parsed_file == nullptr) {
      result = false;
      break;
    }
    parsed_files->push_back(parsed_file);

    // Enforce --disallow_services.
    if (disallow_services_ && parsed_file->service_count() > 0) {
      std::cerr << parsed_file->name()
                << ": This file contains services, but "
                   "--disallow_services was used."
                << std::endl;
      result = false;
      break;
    }

    // Enforce --direct_dependencies
    if (direct_dependencies_explicitly_set_) {
      bool indirect_imports = false;
      for (int i = 0; i < parsed_file->dependency_count(); ++i) {
        if (direct_dependencies_.find(parsed_file->dependency(i)->name()) ==
            direct_dependencies_.end()) {
          indirect_imports = true;
          std::cerr << parsed_file->name() << ": "
                    << absl::StrReplaceAll(
                           direct_dependencies_violation_msg_,
                           {{"%s", parsed_file->dependency(i)->name()}})
                    << std::endl;
        }
      }
      if (indirect_imports) {
        result = false;
        break;
      }
    }
  }
  descriptor_pool->ClearDirectInputFiles();
  return result;
}